

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

_Bool oonf_packet_managed_is_active(oonf_packet_managed *managed,int af_type)

{
  _Bool local_42;
  _Bool local_41;
  int af_type_local;
  oonf_packet_managed *managed_local;
  
  if (af_type == 2) {
    local_41 = false;
    if ((managed->socket_v4).node.next != (list_entity *)0x0) {
      local_41 = (managed->socket_v4).node.prev != (list_entity *)0x0;
    }
    managed_local._7_1_ = local_41;
  }
  else if (af_type == 10) {
    local_42 = false;
    if ((managed->socket_v6).node.next != (list_entity *)0x0) {
      local_42 = (managed->socket_v6).node.prev != (list_entity *)0x0;
    }
    managed_local._7_1_ = local_42;
  }
  else {
    managed_local._7_1_ = false;
  }
  return managed_local._7_1_;
}

Assistant:

bool
oonf_packet_managed_is_active(struct oonf_packet_managed *managed, int af_type) {
  switch (af_type) {
    case AF_INET:
      return oonf_packet_is_active(&managed->socket_v4);
    case AF_INET6:
      return oonf_packet_is_active(&managed->socket_v6);
    default:
      return false;
  }
}